

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *eps2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  type_conflict5 tVar4;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R9;
  int in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000018;
  cpp_dec_float<100U,_int,_void> *in_stack_00000028;
  uint in_stack_00000030;
  long in_stack_00000038;
  int *in_stack_00000040;
  uint *in_stack_00000048;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000d0;
  int *in_stack_000000d8;
  int *in_stack_000000e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000e8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000f0;
  int *rperm_2;
  int k_2;
  int j_2;
  int i_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_2;
  int *rperm_1;
  int k_1;
  int j_1;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff8e8;
  cpp_dec_float<100U,_int,_void> *pcVar5;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff8f0;
  cpp_dec_float<100U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9e0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff9e8;
  cpp_dec_float<100U,_int,_void> local_564;
  undefined4 local_514;
  undefined1 local_510 [80];
  long local_4c0;
  uint local_4b8;
  uint local_4b4;
  int local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb8c;
  int *in_stack_fffffffffffffb90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  int local_3ac;
  int local_3a8;
  undefined4 local_354;
  uint *local_2b0;
  long local_2a8;
  uint local_29c;
  int local_298;
  int local_294;
  int in_stack_fffffffffffffddc;
  int *in_stack_fffffffffffffde0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdf8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe08;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  a = in_R9;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  this_00 = (cpp_dec_float<100U,_int,_void> *)&stack0x00000030;
  pcVar5 = in_stack_00000028;
  vSolveLright2(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                in_stack_000000d0,in_stack_000000c8,(int *)x_1.m_backend.data._M_elems._28_8_,
                (int *)x_1.m_backend.data._M_elems._36_8_,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)x_1.m_backend.data._M_elems._44_8_);
  if (in_stack_00000038 == 0) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00);
    lVar2 = *(long *)(in_RDI + 0x1a8);
    local_3ac = 0;
    for (local_3a8 = 0; local_3a8 < in_stack_00000008; local_3a8 = local_3a8 + 1) {
      uVar1 = (in_R9->m_backend).data._M_elems[local_3a8];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (a,in_R8);
      if (bVar3) {
        enQueueMax((int *)in_R9,&local_3ac,*(int *)(lVar2 + (long)(int)uVar1 * 4));
      }
      else {
        in_stack_fffffffffffffba4 = 0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00);
    local_2b0 = in_stack_00000048;
    local_2a8 = *(long *)(in_RDI + 0x1a8);
    local_298 = 0;
    for (local_294 = 0; local_294 < in_stack_00000008; local_294 = local_294 + 1) {
      local_29c = (in_R9->m_backend).data._M_elems[local_294];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (a,in_R8);
      if (bVar3) {
        *local_2b0 = local_29c;
        local_2b0 = local_2b0 + 1;
        enQueueMax((int *)in_R9,&local_298,*(int *)(local_2a8 + (long)(int)local_29c * 4));
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
      }
      else {
        local_354 = 0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000040 = local_298;
  }
  if ((double)(int)in_stack_00000030 <= (double)*(int *)(in_RDI + 4) * 0.2) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00);
    local_4c0 = *(long *)(in_RDI + 0x1a8);
    local_4b4 = 0;
    for (local_4b0 = 0; local_4b0 < (int)in_stack_00000030; local_4b0 = local_4b0 + 1) {
      local_4b8 = (in_stack_00000028->data)._M_elems[local_4b0];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
      local_20 = local_510;
      local_28 = in_stack_00000018;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_29,in_stack_00000018);
      local_10 = local_510;
      local_18 = local_28;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      local_8 = local_510;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate(this_00);
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar5,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5463ed);
      if (tVar4) {
        enQueueMax((int *)in_stack_00000028,(int *)&local_4b4,
                   *(int *)(local_4c0 + (long)(int)local_4b8 * 4));
      }
      else {
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar5,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x546435);
        if (tVar4) {
          enQueueMax((int *)in_stack_00000028,(int *)&local_4b4,
                     *(int *)(local_4c0 + (long)(int)local_4b8 * 4));
        }
        else {
          local_514 = 0;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (this_00,(long_long_type)pcVar5);
        }
      }
    }
    in_stack_00000030 = local_4b4;
  }
  else {
    (in_stack_00000028->data)._M_elems[0] = *(int *)(in_RDI + 4) - 1;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_564;
  in_stack_00000008 =
       vSolveUright(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                    (int *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                    in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
                    in_stack_000000a0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  vSolveUrightNoNZ(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffffe00,(int *)in_stack_fffffffffffffdf8,
                   in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8);
  if (*(int *)(in_RDI + 0x208) == 0) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    in_stack_00000008 =
         vSolveUpdateRight((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                           in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                           in_stack_fffffffffffffb8c,in_stack_fffffffffffffb80);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    vSolveUpdateRightNoNZ
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  }
  return in_stack_00000008;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}